

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O2

ngx_int_t ngx_http_upstream_copy_content_encoding
                    (ngx_http_request_t *r,ngx_table_elt_t *h,ngx_uint_t offset)

{
  ngx_uint_t nVar1;
  size_t sVar2;
  u_char *puVar3;
  size_t sVar4;
  u_char *puVar5;
  ngx_table_elt_t *pnVar6;
  ngx_int_t nVar7;
  
  pnVar6 = (ngx_table_elt_t *)ngx_list_push(&(r->headers_out).headers);
  if (pnVar6 == (ngx_table_elt_t *)0x0) {
    nVar7 = -1;
  }
  else {
    nVar1 = h->hash;
    sVar2 = (h->key).len;
    puVar3 = (h->key).data;
    sVar4 = (h->value).len;
    puVar5 = h->lowcase_key;
    (pnVar6->value).data = (h->value).data;
    pnVar6->lowcase_key = puVar5;
    (pnVar6->key).data = puVar3;
    (pnVar6->value).len = sVar4;
    pnVar6->hash = nVar1;
    (pnVar6->key).len = sVar2;
    (r->headers_out).content_encoding = pnVar6;
    nVar7 = 0;
  }
  return nVar7;
}

Assistant:

static ngx_int_t
ngx_http_upstream_copy_content_encoding(ngx_http_request_t *r,
    ngx_table_elt_t *h, ngx_uint_t offset)
{
    ngx_table_elt_t  *ho;

    ho = ngx_list_push(&r->headers_out.headers);
    if (ho == NULL) {
        return NGX_ERROR;
    }

    *ho = *h;

    r->headers_out.content_encoding = ho;

    return NGX_OK;
}